

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtio.c
# Opt level: O3

ixy_device * virtio_init(char *pci_addr,uint16_t rx_queues,uint16_t tx_queues)

{
  size_t size;
  undefined2 *puVar1;
  uint *puVar2;
  long *plVar3;
  short sVar4;
  __uid_t _Var5;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  ssize_t sVar9;
  void *pvVar10;
  ulong extraout_RAX;
  undefined8 *puVar11;
  pkt_buf *ppVar12;
  undefined4 extraout_var;
  uint *puVar13;
  mempool *pmVar14;
  ixy_device *piVar15;
  uint in_ECX;
  long lVar16;
  undefined6 in_register_00000012;
  long extraout_RDX;
  long extraout_RDX_00;
  virtio_device *unaff_RBX;
  ulong uVar17;
  ushort uVar18;
  undefined6 in_register_00000032;
  undefined2 *puVar19;
  long lVar20;
  uint32_t uVar21;
  FILE *pFVar22;
  mempool *pmVar23;
  long lVar24;
  undefined *unaff_R12;
  uint uVar25;
  undefined *unaff_R13;
  undefined *puVar26;
  uint uVar27;
  FILE *__stream;
  ulong uVar28;
  char *__buf;
  dma_memory dVar29;
  ushort auStack_358 [256];
  mempool *pmStack_158;
  void *pvStack_150;
  ulong uStack_148;
  ushort uStack_134;
  ushort uStack_132;
  undefined2 *puStack_130;
  short sStack_122;
  ulong uStack_120;
  void *pvStack_118;
  undefined4 uStack_10c;
  mempool *pmStack_108;
  uint *puStack_100;
  undefined *puStack_f8;
  ulong uStack_e8;
  code *pcStack_e0;
  undefined2 uStack_ca;
  FILE *pFStack_c8;
  uint *puStack_c0;
  ulong uStack_b8;
  char *pcStack_b0;
  code *pcStack_a8;
  undefined8 uStack_a0;
  virtio_device *pvStack_98;
  undefined *puStack_90;
  undefined *puStack_88;
  FILE *pFStack_80;
  char *pcStack_78;
  code *pcStack_70;
  undefined8 local_68;
  ulong local_60;
  char local_4c;
  undefined3 uStack_4b;
  ulong local_48;
  void *local_40;
  ulong local_38;
  
  pvVar10 = (void *)(CONCAT62(in_register_00000012,tx_queues) & 0xffffffff);
  __buf = (char *)(CONCAT62(in_register_00000032,rx_queues) & 0xffffffff);
  pcStack_70 = (code *)0x1063fa;
  _Var5 = getuid();
  if (_Var5 != 0) {
    pcStack_70 = (code *)0x106403;
    virtio_init_cold_1();
  }
  if ((ushort)__buf < 2) {
    if (1 < (ushort)pvVar10) goto LAB_00106a47;
    pcStack_70 = (code *)0x106420;
    remove_driver(pci_addr);
    pcStack_70 = (code *)0x10642f;
    unaff_RBX = (virtio_device *)calloc(1,0xb0);
    pcStack_70 = (code *)0x10643a;
    pcVar8 = strdup(pci_addr);
    (unaff_RBX->ixy).pci_addr = pcVar8;
    (unaff_RBX->ixy).driver_name = "ixy-virtio";
    (unaff_RBX->ixy).num_rx_queues = (ushort)__buf;
    (unaff_RBX->ixy).num_tx_queues = (ushort)pvVar10;
    (unaff_RBX->ixy).rx_batch = virtio_rx_batch;
    (unaff_RBX->ixy).tx_batch = virtio_tx_batch;
    (unaff_RBX->ixy).read_stats = virtio_read_stats;
    (unaff_RBX->ixy).set_promisc = virtio_set_promisc;
    (unaff_RBX->ixy).get_link_speed = virtio_get_link_speed;
    pcStack_70 = (code *)0x106490;
    enable_dma(pci_addr);
    pcStack_70 = (code *)0x1064a1;
    uVar6 = pci_open_resource(pci_addr,"config",0);
    in_ECX = 2;
    pvVar10 = (void *)(ulong)uVar6;
    pcStack_70 = (code *)0x1064b9;
    sVar9 = pread(uVar6,&stack0xffffffffffffffb4,2,2);
    if (sVar9 != 2) goto LAB_00106a4e;
    uVar18 = _local_4c;
    __buf = (char *)(ulong)_local_4c;
    pcStack_70 = (code *)0x1064d0;
    close(uVar6);
    if (uVar18 != 0x1000) goto LAB_00106a53;
    unaff_R13 = &stdout;
    __buf = "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c";
    pcStack_70 = (code *)0x10650b;
    fprintf(_stdout,"[INFO ] %s:%d %s(): Detected virtio legacy network card\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
            0x160,"virtio_init");
    pcStack_70 = (code *)0x10651f;
    uVar6 = pci_open_resource(pci_addr,"resource0",2);
    unaff_R12 = &stderr;
    pvVar10 = (void *)(ulong)uVar6;
    unaff_RBX->fd = uVar6;
    pcStack_70 = (code *)0x10654c;
    fprintf(_stderr,"[DEBUG] %s:%d %s(): Configuring bar0\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
            0x113,"virtio_legacy_init");
    in_ECX = 0x12;
    _local_4c = _local_4c & 0xffffff00;
    pcStack_70 = (code *)0x106565;
    sVar9 = pwrite(uVar6,&stack0xffffffffffffffb4,1,0x12);
    if (sVar9 != 1) goto LAB_00106a58;
    pcStack_70 = (code *)0x106585;
    sVar9 = pread(uVar6,&stack0xffffffffffffffb4,1,0x12);
    if (sVar9 == 1) {
      pci_addr = &stack0xffffffffffffffb4;
      do {
        if (local_4c == '\0') goto LAB_001065c0;
        pcStack_70 = (code *)0x1065a1;
        usleep(100);
        pcStack_70 = (code *)0x1065b5;
        sVar9 = pread(uVar6,pci_addr,1,0x12);
      } while (sVar9 == 1);
    }
    pcStack_70 = (code *)0x1065c0;
    virtio_init_cold_5();
LAB_001065c0:
    in_ECX = 0x12;
    _local_4c = CONCAT31(uStack_4b,1);
    pcStack_70 = (code *)0x1065d9;
    sVar9 = pwrite(uVar6,&stack0xffffffffffffffb4,1,0x12);
    if (sVar9 != 1) goto LAB_00106a5d;
    in_ECX = 0x12;
    _local_4c = CONCAT31(uStack_4b,2);
    pcStack_70 = (code *)0x1065fc;
    sVar9 = pwrite(uVar6,&stack0xffffffffffffffb4,1,0x12);
    if (sVar9 != 1) goto LAB_00106a62;
    in_ECX = 0;
    pcStack_70 = (code *)0x106619;
    sVar9 = pread(uVar6,&stack0xffffffffffffffb4,4,0);
    uVar25 = _local_4c;
    if (sVar9 != 4) goto LAB_00106a67;
    in_ECX = 0x11c;
    pcStack_70 = (code *)0x106650;
    fprintf(_stderr,"[DEBUG] %s:%d %s(): Host features: %x\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
            0x11c,"virtio_legacy_init",(ulong)_local_4c);
    pci_addr = (char *)_stderr;
    __buf = (char *)(ulong)~uVar25;
    if ((~uVar25 & 0x8060003) != 0) goto LAB_00106a6c;
    in_ECX = 4;
    pFVar22 = (FILE *)(ulong)uVar6;
    pcStack_70 = (code *)0x10667a;
    sVar9 = pread(uVar6,&stack0xffffffffffffffb4,4,4);
    if (sVar9 != 4) goto LAB_00106a74;
    __buf = &stack0xffffffffffffffb4;
    pcStack_70 = (code *)0x1066b0;
    fprintf((FILE *)pci_addr,"[DEBUG] %s:%d %s(): Guest features before negotiation: %x\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
            0x123,"virtio_legacy_init",(ulong)_local_4c);
    in_ECX = 4;
    _local_4c = 0x8060003;
    pFVar22 = (FILE *)(ulong)uVar6;
    pcStack_70 = (code *)0x1066cb;
    sVar9 = pwrite(uVar6,__buf,4,4);
    __stream = _stderr;
    if (sVar9 != 4) goto LAB_00106a79;
    in_ECX = 4;
    pFVar22 = (FILE *)(ulong)uVar6;
    pcStack_70 = (code *)0x1066ef;
    sVar9 = pread(uVar6,&stack0xffffffffffffffb4,4,4);
    if (sVar9 != 4) goto LAB_00106a7e;
    __buf = &stack0xffffffffffffffb4;
    pcStack_70 = (code *)0x106725;
    fprintf(__stream,"[DEBUG] %s:%d %s(): Guest features after negotiation: %x\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
            0x125,"virtio_legacy_init",(ulong)_local_4c);
    in_ECX = 0xe;
    _local_4c = _local_4c & 0xffff0000;
    pFVar22 = (FILE *)(ulong)uVar6;
    pcStack_70 = (code *)0x10673f;
    sVar9 = pwrite(uVar6,__buf,2,0xe);
    if (sVar9 != 2) goto LAB_00106a83;
    in_ECX = 0xc;
    pFVar22 = (FILE *)(ulong)uVar6;
    pcStack_70 = (code *)0x10675f;
    sVar9 = pread(uVar6,&stack0xffffffffffffffb4,2,0xc);
    uVar25 = _local_4c;
    if (sVar9 != 2) goto LAB_00106a88;
    uVar18 = _local_4c;
    __stream = (FILE *)(ulong)_local_4c;
    uVar27 = _local_4c & 0xffff;
    local_68 = (void *)(CONCAT44(local_68._4_4_,_local_4c) & 0xffffffff0000ffff);
    pcStack_70 = (code *)0x10679b;
    fprintf(_stderr,"[DEBUG] %s:%d %s(): Max queue size of rx queue #%u: %u\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
            0xe5,"virtio_legacy_setup_rx_queue",0);
    if (uVar27 == 0) {
LAB_001067a4:
      unaff_R13 = &stdout;
      pcStack_70 = (code *)0x1067b1;
      virtio_legacy_setup_tx_queue(unaff_RBX,1);
      pcStack_70 = (code *)0x1067be;
      virtio_legacy_setup_tx_queue(unaff_RBX,2);
      in_ECX = 0x12;
      uVar6 = unaff_RBX->fd;
      pvVar10 = (void *)(ulong)uVar6;
      _local_4c = CONCAT31(uStack_4b,4);
      pFVar22 = (FILE *)(ulong)uVar6;
      pcStack_70 = (code *)0x1067dd;
      sVar9 = pwrite(uVar6,&stack0xffffffffffffffb4,1,0x12);
      if (sVar9 != 1) goto LAB_00106a8d;
      pcStack_70 = (code *)0x10680c;
      fprintf(_stdout,"[INFO ] %s:%d %s(): Setup complete\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
              ,0x12e,"virtio_legacy_init");
      in_ECX = 0x12;
      pFVar22 = (FILE *)(ulong)uVar6;
      pcStack_70 = (code *)0x106822;
      sVar9 = pread(uVar6,&stack0xffffffffffffffb4,1,0x12);
      if (sVar9 != 1) goto LAB_00106a92;
      if (local_4c != -0x80) {
        pcStack_70 = (code *)0x106844;
        virtio_legacy_set_promiscuous(unaff_RBX,true);
        return &unaff_RBX->ixy;
      }
      goto LAB_00106a97;
    }
    in_ECX = 0x10;
    pFVar22 = (FILE *)(ulong)uVar6;
    pcStack_70 = (code *)0x10686c;
    sVar9 = pread(uVar6,&stack0xffffffffffffffb4,2,0x10);
    if (sVar9 == 2) {
      local_38 = (ulong)_local_4c;
      pcStack_70 = (code *)0x1068a9;
      fprintf(_stderr,"[DEBUG] %s:%d %s(): Notifcation offset %u\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
              ,0xea,"virtio_legacy_setup_rx_queue");
      local_48 = (ulong)((uVar25 & 0xffff) * 8);
      __buf = (char *)((ulong)(((uVar25 & 0xffff) + (uVar25 & 0xffff) * 8) * 2 + 0x1003 & 0x3ff000)
                       + 4 + local_48);
      pcStack_70 = (code *)0x1068d8;
      dVar29 = memory_allocate_dma((size_t)__buf,true);
      pvVar10 = dVar29.virt;
      pcStack_70 = (code *)0x1068ee;
      memset(pvVar10,0xab,(size_t)__buf);
      pcStack_70 = (code *)0x10691f;
      local_68 = pvVar10;
      local_40 = pvVar10;
      fprintf(_stderr,"[DEBUG] %s:%d %s(): Allocated %zu bytes for virt queue at %p\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
              ,0xee,"virtio_legacy_setup_rx_queue",__buf);
      pFVar22 = (FILE *)(ulong)(uint)unaff_RBX->fd;
      unaff_R13 = (undefined *)(dVar29.phy >> 0xc);
      in_ECX = 8;
      _local_4c = (uint)unaff_R13;
      pcStack_70 = (code *)0x10693d;
      sVar9 = pwrite(unaff_RBX->fd,&stack0xffffffffffffffb4,4,8);
      if (sVar9 != 4) goto LAB_00106aa1;
      __buf = (char *)(ulong)(uVar25 & 0xffff);
      pcStack_70 = (code *)0x10695d;
      puVar13 = (uint *)calloc(1,local_48 + 0x38);
      *puVar13 = uVar25 & 0xffff;
      pFVar22 = _stderr;
      *(void **)(puVar13 + 2) = local_40;
      local_68 = (void *)((ulong)uVar18 * 0x10 + (long)local_40);
      *(void **)(puVar13 + 4) = local_68;
      local_60 = (long)local_68 + (long)__buf * 2 + 0x1003 & 0xfffffffffffff000;
      *(ulong *)(puVar13 + 6) = local_60;
      pcStack_70 = (code *)0x1069ba;
      fprintf(pFVar22,"[DEBUG] %s:%d %s(): vring desc: %p, vring avail: %p, vring used: %p\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
              ,0xf4,"virtio_legacy_setup_rx_queue");
      uVar6 = *puVar13;
      puVar19 = *(undefined2 **)(puVar13 + 6);
      if ((ulong)uVar6 != 0) {
        lVar16 = *(long *)(puVar13 + 2);
        lVar24 = *(long *)(puVar13 + 4);
        lVar20 = 0;
        do {
          puVar11 = (undefined8 *)(lVar16 + lVar20 * 8);
          *puVar11 = 0;
          puVar11[1] = 0;
          *(undefined2 *)(lVar24 + 4 + lVar20) = 0;
          *(undefined8 *)(puVar19 + lVar20 * 2 + 2) = 0;
          lVar20 = lVar20 + 2;
        } while ((ulong)uVar6 * 2 != lVar20);
      }
      puVar19[1] = 0;
      __stream = (FILE *)((ulong)uVar18 << 2);
      puVar1 = *(undefined2 **)(puVar13 + 4);
      puVar1[1] = 0;
      *(undefined2 *)(puVar13 + 10) = 0;
      *(ulong *)(puVar13 + 8) = local_38;
      *puVar1 = 1;
      *puVar19 = 0;
      pcStack_70 = (code *)0x106a2b;
      pmVar14 = memory_allocate_mempool((uint32_t)__stream,0x800);
      *(mempool **)(puVar13 + 0xc) = pmVar14;
      unaff_RBX->rx_queue = puVar13;
      goto LAB_001067a4;
    }
  }
  else {
    pcStack_70 = (code *)0x106a47;
    virtio_init_cold_21();
LAB_00106a47:
    pcStack_70 = (code *)0x106a4e;
    virtio_init_cold_20();
LAB_00106a4e:
    pcStack_70 = (code *)0x106a53;
    virtio_init_cold_2();
LAB_00106a53:
    pcStack_70 = (code *)0x106a58;
    virtio_init_cold_3();
LAB_00106a58:
    pcStack_70 = (code *)0x106a5d;
    virtio_init_cold_4();
LAB_00106a5d:
    pcStack_70 = (code *)0x106a62;
    virtio_init_cold_6();
LAB_00106a62:
    pcStack_70 = (code *)0x106a67;
    virtio_init_cold_7();
LAB_00106a67:
    pcStack_70 = (code *)0x106a6c;
    virtio_init_cold_8();
LAB_00106a6c:
    pcStack_70 = (code *)0x106a74;
    pFVar22 = (FILE *)pci_addr;
    virtio_init_cold_9();
LAB_00106a74:
    pcStack_70 = (code *)0x106a79;
    virtio_init_cold_10();
LAB_00106a79:
    __stream = (FILE *)pci_addr;
    pcStack_70 = (code *)0x106a7e;
    virtio_init_cold_11();
LAB_00106a7e:
    pcStack_70 = (code *)0x106a83;
    virtio_init_cold_12();
LAB_00106a83:
    pcStack_70 = (code *)0x106a88;
    virtio_init_cold_13();
LAB_00106a88:
    pcStack_70 = (code *)0x106a8d;
    virtio_init_cold_14();
LAB_00106a8d:
    pcStack_70 = (code *)0x106a92;
    virtio_init_cold_17();
LAB_00106a92:
    pcStack_70 = (code *)0x106a97;
    virtio_init_cold_18();
LAB_00106a97:
    pcStack_70 = (code *)0x106a9c;
    virtio_init_cold_19();
  }
  pcStack_70 = (code *)0x106aa1;
  virtio_init_cold_15();
LAB_00106aa1:
  pcStack_70 = virtio_rx_batch;
  virtio_init_cold_16();
  puVar13 = (uint *)pFVar22->_old_offset;
  uStack_a0 = extraout_RAX;
  pvStack_98 = unaff_RBX;
  puStack_90 = unaff_R12;
  puStack_88 = unaff_R13;
  pFStack_80 = __stream;
  pcStack_78 = __buf;
  pcStack_70 = (code *)pvVar10;
  if (in_ECX == 0) {
    uVar28 = 0;
  }
  else {
    uVar28 = 0;
    do {
      uVar18 = (ushort)puVar13[10];
      lVar16 = *(long *)(puVar13 + 6);
      if (uVar18 == *(ushort *)(lVar16 + 2)) goto LAB_00106b4d;
      uVar17 = (ulong)uVar18 % (ulong)*puVar13;
      uVar6 = *(uint *)(lVar16 + 4 + uVar17 * 8);
      *(ushort *)(puVar13 + 10) = uVar18 + 1;
      lVar24 = (ulong)uVar6 * 0x10;
      uVar18 = *(ushort *)(*(long *)(puVar13 + 2) + 0xc + lVar24);
      pmVar14 = (mempool *)(ulong)uVar18;
      if (uVar18 != 2) {
        pcStack_a8 = (code *)0x106c3c;
        virtio_rx_batch_cold_1();
        goto LAB_00106c3c;
      }
      puVar11 = (undefined8 *)(*(long *)(puVar13 + 2) + lVar24);
      *puVar11 = 0;
      puVar11[1] = 0;
      lVar24 = *(long *)(puVar13 + (ulong)*(uint *)(lVar16 + 4 + uVar17 * 8) * 2 + 0xe);
      uVar6 = *(int *)(lVar16 + 8 + uVar17 * 8) - 10;
      *(uint *)(lVar24 + 0x14) = uVar6;
      *(long *)(extraout_RDX + uVar28 * 8) = lVar24;
      pFVar22->__pad2 = (void *)((long)pFVar22->__pad2 + (ulong)uVar6);
      pFVar22->_offset = pFVar22->_offset + 1;
      uVar28 = uVar28 + 1;
    } while (in_ECX != uVar28);
    uVar28 = (ulong)in_ECX;
  }
LAB_00106b4d:
  uVar6 = *puVar13;
  if (uVar6 != 0) {
    puVar26 = (undefined *)0x0;
    do {
      lVar16 = *(long *)(puVar13 + 2);
      __buf = (char *)((ulong)puVar26 & 0xffff);
      if (*(long *)(lVar16 + (ulong)(uint)((int)__buf << 4)) == 0) {
        pmVar14 = *(mempool **)(puVar13 + 0xc);
        pcStack_a8 = (code *)0x106b82;
        ppVar12 = pkt_buf_alloc(pmVar14);
        in_ECX = (uint)lVar16;
        pvVar10 = (void *)0x0;
        unaff_R13 = puVar26;
        if (ppVar12 == (pkt_buf *)0x0) goto LAB_00106c3c;
        uVar17 = (ulong)(uint)((int)__buf << 4);
        uVar21 = *(uint32_t *)(*(long *)(puVar13 + 0xc) + 8);
        ppVar12->size = uVar21;
        ppVar12->head_room[0x26] = '\0';
        ppVar12->head_room[0x27] = '\0';
        ppVar12->head_room[0x1e] = '\0';
        ppVar12->head_room[0x1f] = '\0';
        ppVar12->head_room[0x20] = '*';
        ppVar12->head_room[0x21] = '\0';
        ppVar12->head_room[0x22] = '\0';
        ppVar12->head_room[0x23] = '\0';
        ppVar12->head_room[0x24] = '\0';
        ppVar12->head_room[0x25] = '\0';
        lVar16 = *(long *)(puVar13 + 2);
        *(uint32_t *)(lVar16 + 8 + uVar17) = uVar21 + 10;
        *(uintptr_t *)(lVar16 + uVar17) = ppVar12->buf_addr_phy + 0x36;
        *(undefined4 *)(lVar16 + 0xc + uVar17) = 2;
        *(pkt_buf **)(puVar13 + (long)__buf * 2 + 0xe) = ppVar12;
        *(short *)(*(long *)(puVar13 + 4) + 4 +
                  ((ulong)*(ushort *)(*(long *)(puVar13 + 4) + 2) % (ulong)*puVar13) * 2) =
             (short)puVar26;
        in_ECX = 0x10;
        *(short *)(*(long *)(puVar13 + 4) + 2) = *(short *)(*(long *)(puVar13 + 4) + 2) + 1;
        pmVar14 = (mempool *)(ulong)(uint)pFVar22->_fileno;
        uStack_a0 = uStack_a0 & 0xffffffffffff;
        pcStack_a8 = (code *)0x106c0c;
        sVar9 = pwrite(pFVar22->_fileno,(void *)((long)&uStack_a0 + 6),2,0x10);
        if (sVar9 != 2) goto LAB_00106c41;
        uVar6 = *puVar13;
      }
      uVar25 = (int)puVar26 + 1;
      puVar26 = (undefined *)(ulong)uVar25;
    } while ((uVar25 & 0xffff) < uVar6);
  }
  return (ixy_device *)(uVar28 & 0xffffffff);
LAB_00106c3c:
  pcStack_a8 = (code *)0x106c41;
  virtio_rx_batch_cold_3();
LAB_00106c41:
  pcStack_a8 = virtio_tx_batch;
  virtio_rx_batch_cold_2();
  puVar2 = *(uint **)&pmVar14[5].buf_size;
  uVar17 = (ulong)in_ECX;
  pFStack_c8 = pFVar22;
  puStack_c0 = puVar13;
  uStack_b8 = uVar28;
  pcStack_b0 = __buf;
  pcStack_a8 = (code *)pvVar10;
  while( true ) {
    if ((ushort)puVar2[10] == *(ushort *)(*(long *)(puVar2 + 6) + 2)) break;
    uVar28 = (ulong)*(uint *)(*(long *)(puVar2 + 6) + 4 +
                             ((ulong)(ushort)puVar2[10] % (ulong)*puVar2) * 8);
    lVar16 = *(long *)(puVar2 + 2);
    lVar24 = uVar28 * 0x10;
    *(undefined8 *)(lVar16 + lVar24) = 0;
    *(undefined4 *)(lVar16 + 8 + lVar24) = 0;
    pcStack_e0 = (code *)0x106ca8;
    pkt_buf_free(*(pkt_buf **)(puVar2 + uVar28 * 2 + 0xe));
    *(short *)(puVar2 + 10) = (short)puVar2[10] + 1;
  }
  if (in_ECX == 0) {
    uVar28 = 0;
  }
  else {
    uVar6 = *puVar2;
    uVar28 = 0;
    uVar18 = 0;
    do {
      uVar25 = (uint)uVar18;
      if (uVar18 < uVar6) {
        lVar16 = *(long *)(*(long *)(puVar2 + 2) + (ulong)uVar18 * 0x10);
        while (lVar16 != 0) {
          uVar18 = uVar18 + 1;
          uVar25 = (uint)uVar18;
          if (uVar6 <= uVar18) break;
          lVar16 = *(long *)(*(long *)(puVar2 + 2) + (ulong)uVar18 * 0x10);
        }
      }
      if (uVar6 == uVar25) goto code_r0x00106d8f;
      plVar3 = *(long **)(extraout_RDX_00 + uVar28 * 8);
      lVar24 = (ulong)uVar18 * 0x10;
      uVar6 = *(uint *)((long)plVar3 + 0x14);
      pmVar14[7].base_addr = (void *)((long)pmVar14[7].base_addr + (ulong)uVar6);
      *(long *)&pmVar14[6].buf_size = *(long *)&pmVar14[6].buf_size + 1;
      *(long **)(puVar2 + (ulong)uVar18 * 2 + 0xe) = plVar3;
      *(undefined2 *)((long)plVar3 + 0x3e) = 0;
      *(undefined8 *)((long)plVar3 + 0x36) = 0x2a0000;
      lVar16 = *(long *)(puVar2 + 2);
      *(uint *)(lVar16 + 8 + lVar24) = uVar6 + 10;
      *(long *)(lVar16 + lVar24) = *plVar3 + 0x36;
      *(undefined4 *)(lVar16 + 0xc + lVar24) = 0;
      uVar6 = *puVar2;
      iVar7 = (int)uVar28;
      uVar28 = uVar28 + 1;
      *(ushort *)
       (*(long *)(puVar2 + 4) + 4 +
       ((ulong)((uint)*(ushort *)(*(long *)(puVar2 + 4) + 2) + iVar7) % (ulong)uVar6) * 2) = uVar18;
    } while (uVar28 != uVar17);
    uVar28 = (ulong)in_ECX;
  }
code_r0x00106d8f:
  puVar19 = &uStack_ca;
  *(short *)(*(long *)(puVar2 + 4) + 2) = *(short *)(*(long *)(puVar2 + 4) + 2) + (short)uVar28;
  pmVar23 = (mempool *)(ulong)pmVar14[4].free_stack_top;
  uStack_ca = 1;
  pcStack_e0 = (code *)0x106db8;
  sVar9 = pwrite(pmVar14[4].free_stack_top,puVar19,2,0x10);
  uVar6 = (uint)puVar19;
  if (sVar9 == 2) {
    return (ixy_device *)(uVar28 & 0xffffffff);
  }
  pcStack_e0 = virtio_legacy_setup_tx_queue;
  virtio_tx_batch_cold_1();
  sVar4 = (short)uVar6;
  pmStack_108 = pmVar14;
  puStack_100 = puVar2;
  puStack_f8 = unaff_R13;
  uStack_e8 = uVar28;
  pcStack_e0 = (code *)uVar17;
  if ((ushort)(sVar4 - 3U) < 0xfffe) {
    pmStack_158 = (mempool *)0x1070ae;
    virtio_legacy_setup_tx_queue_cold_5();
    uVar21 = (uint32_t)pmVar23;
LAB_001070ae:
    pmStack_158 = (mempool *)0x1070b3;
    virtio_legacy_setup_tx_queue_cold_1();
LAB_001070b3:
    pmStack_158 = (mempool *)0x1070b8;
    virtio_legacy_setup_tx_queue_cold_2();
  }
  else {
    uVar21 = pmVar23[4].free_stack_top;
    pmStack_158 = (mempool *)0x106e10;
    sStack_122 = sVar4;
    sVar9 = pwrite(uVar21,&sStack_122,2,0xe);
    pmVar14 = pmVar23;
    if (sVar9 != 2) goto LAB_001070ae;
    uVar21 = pmVar23[4].free_stack_top;
    pmStack_158 = (mempool *)0x106e31;
    sVar9 = pread(uVar21,&uStack_134,2,0xc);
    if (sVar9 != 2) goto LAB_001070b3;
    pvStack_150 = (void *)CONCAT44(pvStack_150._4_4_,(uint)uStack_134);
    pmStack_158 = (mempool *)0x106e75;
    iVar7 = fprintf(_stderr,"[DEBUG] %s:%d %s(): Max queue size of tx queue #%u: %u\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
                    ,0x37,"virtio_legacy_setup_tx_queue",(ulong)(uVar6 & 0xffff));
    uVar6 = (uint)uStack_134;
    if (uStack_134 == 0) {
      return (ixy_device *)CONCAT44(extraout_var,iVar7);
    }
    uStack_120 = (ulong)((uint)uStack_134 * 8);
    size = (ulong)(((uint)uStack_134 + (uint)uStack_134 * 8) * 2 + 0x1003 & 0x3ff000) + 4 +
           uStack_120;
    pmStack_158 = (mempool *)0x106eb8;
    dVar29 = memory_allocate_dma(size,true);
    puStack_130 = (undefined2 *)dVar29.phy;
    pvVar10 = dVar29.virt;
    pmStack_158 = (mempool *)0x106ed0;
    memset(pvVar10,0xab,size);
    pmStack_158 = (mempool *)0x106f01;
    pvStack_150 = pvVar10;
    pvStack_118 = pvVar10;
    fprintf(_stderr,"[DEBUG] %s:%d %s(): Allocated %zu bytes for virt queue at %p\n",
            "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c",
            0x3e,"virtio_legacy_setup_tx_queue",size);
    uVar21 = pmVar23[4].free_stack_top;
    uStack_10c = (undefined4)((ulong)puStack_130 >> 0xc);
    pmStack_158 = (mempool *)0x106f23;
    sVar9 = pwrite(uVar21,&uStack_10c,4,8);
    if (sVar9 == 4) {
      pmStack_158 = (mempool *)0x106f43;
      puVar13 = (uint *)calloc(1,uStack_120 + 0x38);
      *puVar13 = uVar6;
      pFVar22 = _stderr;
      *(void **)(puVar13 + 2) = pvStack_118;
      pvStack_150 = (void *)((ulong)uStack_134 * 0x10 + (long)pvStack_118);
      *(void **)(puVar13 + 4) = pvStack_150;
      uStack_148 = (long)pvStack_150 + (ulong)uVar6 * 2 + 0x1003 & 0xfffffffffffff000;
      *(ulong *)(puVar13 + 6) = uStack_148;
      pmStack_158 = (mempool *)0x106fa1;
      fprintf(pFVar22,"[DEBUG] %s:%d %s(): vring desc: %p, vring avail: %p, vring used: %p\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
              ,0x44,"virtio_legacy_setup_tx_queue");
      uVar25 = *puVar13;
      puVar19 = *(undefined2 **)(puVar13 + 6);
      if ((ulong)uVar25 != 0) {
        lVar16 = *(long *)(puVar13 + 2);
        lVar24 = *(long *)(puVar13 + 4);
        lVar20 = 0;
        do {
          puVar11 = (undefined8 *)(lVar16 + lVar20 * 8);
          *puVar11 = 0;
          puVar11[1] = 0;
          *(undefined2 *)(lVar24 + 4 + lVar20) = 0;
          *(undefined8 *)(puVar19 + lVar20 * 2 + 2) = 0;
          lVar20 = lVar20 + 2;
        } while ((ulong)uVar25 * 2 != lVar20);
      }
      puVar19[1] = 0;
      puStack_130 = *(undefined2 **)(puVar13 + 4);
      puStack_130[1] = 0;
      *(undefined2 *)(puVar13 + 10) = 0;
      uVar21 = pmVar23[4].free_stack_top;
      pmStack_158 = (mempool *)0x107011;
      sVar9 = pread(uVar21,&uStack_132,2,0x10);
      if (sVar9 == 2) {
        pmStack_158 = (mempool *)0x10704b;
        fprintf(_stderr,"[DEBUG] %s:%d %s(): vq notifcation offset %u\n",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/virtio.c"
                ,0x54,"virtio_legacy_setup_tx_queue",(ulong)uStack_132);
        *(ulong *)(puVar13 + 8) = (ulong)uStack_132;
        if (sVar4 == 2) {
          pmStack_158 = (mempool *)0x107064;
          pmVar14 = memory_allocate_mempool(uVar6,0x800);
          *(mempool **)(puVar13 + 0xc) = pmVar14;
          **(undefined2 **)(puVar13 + 4) = 1;
          **(undefined2 **)(puVar13 + 6) = 0;
        }
        else {
          *puStack_130 = 1;
          piVar15 = (ixy_device *)0x80;
          *puVar19 = 0;
          if (sVar4 == 1) goto LAB_001070a0;
        }
        piVar15 = (ixy_device *)0x88;
LAB_001070a0:
        *(uint **)((long)&piVar15->pci_addr + (long)&pmVar23->base_addr) = puVar13;
        return piVar15;
      }
      goto LAB_001070bd;
    }
  }
  pmStack_158 = (mempool *)0x1070bd;
  virtio_legacy_setup_tx_queue_cold_3();
LAB_001070bd:
  pmStack_158 = (mempool *)0x1070c2;
  virtio_legacy_setup_tx_queue_cold_4();
  pmStack_158 = pmVar14;
  iVar7 = ioctl(uVar21,0x3b6c);
  if (iVar7 == -1) {
    vfio_enable_dma_cold_1();
  }
  else {
    auStack_358[0] = 0;
    sVar9 = pread(uVar21,auStack_358,2,4);
    if (sVar9 == 2) {
      auStack_358[0] = auStack_358[0] | 4;
      sVar9 = pwrite(uVar21,auStack_358,2,4);
      if (sVar9 != 2) {
        __assert_fail("pwrite(device_fd, &dma, 2, conf_reg.offset + command_register_offset) == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c"
                      ,0x27,"void vfio_enable_dma(int)");
      }
      return (ixy_device *)0x2;
    }
  }
  __assert_fail("pread(device_fd, &dma, 2, conf_reg.offset + command_register_offset) == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/libixy-vfio.c"
                ,0x25,"void vfio_enable_dma(int)");
}

Assistant:

struct ixy_device* virtio_init(const char* pci_addr, uint16_t rx_queues, uint16_t tx_queues) {
	if (getuid()) {
		warn("Not running as root, this will probably fail");
	}
	if (rx_queues > 1) {
		error("cannot configure %d rx queues: limit is %d", rx_queues, 1);
	}
	if (tx_queues > 1) {
		error("cannot configure %d tx queues: limit is %d", tx_queues, 1);
	}
	remove_driver(pci_addr);
	struct virtio_device* dev = calloc(1, sizeof(*dev));
	dev->ixy.pci_addr = strdup(pci_addr);
	dev->ixy.driver_name = driver_name;
	dev->ixy.num_rx_queues = rx_queues;
	dev->ixy.num_tx_queues = tx_queues;
	dev->ixy.rx_batch = virtio_rx_batch;
	dev->ixy.tx_batch = virtio_tx_batch;
	dev->ixy.read_stats = virtio_read_stats;
	dev->ixy.set_promisc = virtio_set_promisc;
	dev->ixy.get_link_speed = virtio_get_link_speed;
	enable_dma(pci_addr);
	int config = pci_open_resource(pci_addr, "config", O_RDONLY);
	uint16_t device_id = read_io16(config, 2);
	close(config);
	// Check config if device is legacy network card
	if (device_id == 0x1000) {
		info("Detected virtio legacy network card");
		dev->fd = pci_open_resource(pci_addr, "resource0", O_RDWR);
		virtio_legacy_init(dev);
	} else {
		error("Modern device not supported");
	}
	return &dev->ixy;
}